

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O0

void __thiscall
QtPrivate::BindingStatusOrList::setStatusAndClearList
          (BindingStatusOrList *this,QBindingStatus *status)

{
  bool bVar1;
  memory_order mVar2;
  List *pLVar3;
  quintptr qVar4;
  QBindingStatus *in_RSI;
  quintptr *in_RDI;
  long in_FS_OFFSET;
  QObject *obj;
  List *__range2;
  List *pendingObjects;
  memory_order __b;
  iterator __end2;
  iterator __begin2;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  vector<QObject_*,_std::allocator<QObject_*>_> *in_stack_ffffffffffffff80;
  BindingStatusOrList *in_stack_ffffffffffffff88;
  int __line;
  QObjectPrivate *in_stack_ffffffffffffff90;
  __normal_iterator<QObject_**,_std::vector<QObject_*,_std::allocator<QObject_*>_>_> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pLVar3 = list(in_stack_ffffffffffffff88);
  __line = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (pLVar3 != (List *)0x0) {
    local_10._M_current = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    local_10._M_current =
         (QObject **)
         std::vector<QObject_*,_std::allocator<QObject_*>_>::begin(in_stack_ffffffffffffff80);
    std::vector<QObject_*,_std::allocator<QObject_*>_>::end(in_stack_ffffffffffffff80);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<QObject_**,_std::vector<QObject_*,_std::allocator<QObject_*>_>_>
                               *)in_stack_ffffffffffffff80,
                              (__normal_iterator<QObject_**,_std::vector<QObject_*,_std::allocator<QObject_*>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)),
          bVar1) {
      __gnu_cxx::__normal_iterator<QObject_**,_std::vector<QObject_*,_std::allocator<QObject_*>_>_>
      ::operator*(&local_10);
      in_stack_ffffffffffffff90 = QObjectPrivate::get((QObject *)0x556256);
      QObjectPrivate::reinitBindingStorageAfterThreadMove(in_stack_ffffffffffffff90);
      __gnu_cxx::__normal_iterator<QObject_**,_std::vector<QObject_*,_std::allocator<QObject_*>_>_>
      ::operator++(&local_10);
    }
    if (pLVar3 != (List *)0x0) {
      std::vector<QObject_*,_std::allocator<QObject_*>_>::~vector
                ((vector<QObject_*,_std::allocator<QObject_*>_> *)in_stack_ffffffffffffff90);
      operator_delete(pLVar3,0x18);
    }
    __line = (int)((ulong)pLVar3 >> 0x20);
  }
  qVar4 = encodeBindingStatus(in_RSI);
  mVar2 = std::operator&(memory_order_release,__memory_order_mask);
  if (mVar2 == memory_order_acquire) {
    std::__replacement_assert
              ((char *)in_stack_ffffffffffffff90,__line,(char *)in_RDI,
               (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  if (mVar2 == memory_order_acq_rel) {
    std::__replacement_assert
              ((char *)in_stack_ffffffffffffff90,__line,(char *)in_RDI,
               (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  if (mVar2 == memory_order_consume) {
    std::__replacement_assert
              ((char *)in_stack_ffffffffffffff90,__line,(char *)in_RDI,
               (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  *in_RDI = qVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QtPrivate::BindingStatusOrList::setStatusAndClearList(QBindingStatus *status) noexcept
{

    if (auto pendingObjects = list()) {
        for (auto obj: *pendingObjects)
            QObjectPrivate::get(obj)->reinitBindingStorageAfterThreadMove();
        delete pendingObjects;
    }
    // synchronizes-with the load-acquire in bindingStatus():
    data.store(encodeBindingStatus(status), std::memory_order_release);
}